

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O2

void __thiscall
Eigen::Matrix<double,-1,-1,0,-1,-1>::
Matrix<Eigen::internal::inverse_impl<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
          (Matrix<double,_1,_1,0,_1,_1> *this,
          ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
          *other)

{
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this,
             *(Index *)(*(long *)other + 8),*(Index *)(*(long *)other + 0x10));
  internal::inverse_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((inverse_impl<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)other,
             (Matrix<double,__1,__1,_0,__1,__1> *)this);
  return;
}

Assistant:

EIGEN_STRONG_INLINE Matrix(const ReturnByValue<OtherDerived>& other)
    {
      Base::_check_template_params();
      Base::resize(other.rows(), other.cols());
      other.evalTo(*this);
    }